

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

rotation_t *
opengv::relative_pose::eigensolver
          (RelativeAdapterBase *adapter,vector<int,_std::allocator<int>_> *indices,
          eigensolverOutput_t *output,bool useWeights)

{
  Indices *in_RDI;
  Indices idx;
  undefined1 in_stack_00000607;
  eigensolverOutput_t *in_stack_00000608;
  Indices *in_stack_00000610;
  RelativeAdapterBase *in_stack_00000618;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  
  Indices::Indices(in_RDI,in_stack_ffffffffffffffa8);
  eigensolver(in_stack_00000618,in_stack_00000610,in_stack_00000608,(bool)in_stack_00000607);
  return (rotation_t *)in_RDI;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::eigensolver(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices,
    eigensolverOutput_t & output,
    bool useWeights )
{
  Indices idx(indices);
  return eigensolver(adapter,idx,output,useWeights);
}